

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph
          (xmlSchemaBucketPtr_conflict bucket,xmlSchemaTypeType type,xmlChar *name,xmlChar *nsName)

{
  xmlChar *pxVar1;
  xmlSchemaBasicItemPtr pxVar2;
  xmlSchemaSchemaRelationPtr_conflict local_48;
  xmlSchemaSchemaRelationPtr_conflict rel;
  int i;
  xmlSchemaBasicItemPtr ret;
  xmlChar *nsName_local;
  xmlChar *name_local;
  xmlSchemaTypeType type_local;
  xmlSchemaBucketPtr_conflict bucket_local;
  
  if ((bucket != (xmlSchemaBucketPtr_conflict)0x0) && (name != (xmlChar *)0x0)) {
    if ((bucket->globals != (xmlSchemaItemListPtr)0x0) && (bucket->globals->nbItems != 0)) {
      for (rel._4_4_ = 0; rel._4_4_ < bucket->globals->nbItems; rel._4_4_ = rel._4_4_ + 1) {
        pxVar2 = (xmlSchemaBasicItemPtr)bucket->globals->items[rel._4_4_];
        if (pxVar2->type == type) {
          if (type - XML_SCHEMA_TYPE_SIMPLE < 2) {
            if (*(xmlChar **)(pxVar2 + 1) == name) {
              pxVar1 = *(xmlChar **)(pxVar2 + 0xd);
              goto joined_r0x00227815;
            }
          }
          else if (type == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
            if (*(xmlChar **)(pxVar2 + 1) == name) {
              pxVar1 = (xmlChar *)pxVar2[6].dummy;
              goto joined_r0x00227815;
            }
          }
          else {
            if (type != XML_SCHEMA_TYPE_GROUP) {
              return (xmlSchemaBasicItemPtr)0x0;
            }
            if (*(xmlChar **)(pxVar2 + 2) == name) {
              pxVar1 = (xmlChar *)pxVar2[2].dummy;
joined_r0x00227815:
              if (pxVar1 == nsName) {
                return pxVar2;
              }
            }
          }
        }
      }
    }
    if (bucket->relations != (xmlSchemaSchemaRelationPtr_conflict)0x0) {
      local_48 = bucket->relations;
      bucket->flags = bucket->flags | 1;
      do {
        if (((local_48->bucket != (xmlSchemaBucketPtr)0x0) && ((local_48->bucket->flags & 1U) == 0))
           && (pxVar2 = xmlSchemaFindRedefCompInGraph(local_48->bucket,type,name,nsName),
              pxVar2 != (xmlSchemaBasicItemPtr)0x0)) {
          return pxVar2;
        }
        local_48 = local_48->next;
      } while (local_48 != (xmlSchemaSchemaRelationPtr)0x0);
      bucket->flags = bucket->flags ^ 1;
    }
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph(xmlSchemaBucketPtr bucket,
			      xmlSchemaTypeType type,
			      const xmlChar *name,
			      const xmlChar *nsName)
{
    xmlSchemaBasicItemPtr ret;
    int i;

    if ((bucket == NULL) || (name == NULL))
	return(NULL);
    if ((bucket->globals == NULL) ||
	(bucket->globals->nbItems == 0))
	goto subschemas;
    /*
    * Search in global components.
    */
    for (i = 0; i < bucket->globals->nbItems; i++) {
	ret = bucket->globals->items[i];
	if (ret->type == type) {
	    switch (type) {
		case XML_SCHEMA_TYPE_COMPLEX:
		case XML_SCHEMA_TYPE_SIMPLE:
		    if ((WXS_COMP_NAME(ret, xmlSchemaTypePtr) == name) &&
			(WXS_COMP_TNS(ret, xmlSchemaTypePtr) ==
			nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaModelGroupDefPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaModelGroupDefPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaAttributeGroupPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaAttributeGroupPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		default:
		    /* Should not be hit. */
		    return(NULL);
	    }
	}
    }
subschemas:
    /*
    * Process imported/included schemas.
    */
    if (bucket->relations != NULL) {
	xmlSchemaSchemaRelationPtr rel = bucket->relations;

	/*
	* TODO: Marking the bucket will not avoid multiple searches
	* in the same schema, but avoids at least circularity.
	*/
	bucket->flags |= XML_SCHEMA_BUCKET_MARKED;
	do {
	    if ((rel->bucket != NULL) &&
		((rel->bucket->flags & XML_SCHEMA_BUCKET_MARKED) == 0)) {
		ret = xmlSchemaFindRedefCompInGraph(rel->bucket,
		    type, name, nsName);
		if (ret != NULL)
		    return(ret);
	    }
	    rel = rel->next;
	} while (rel != NULL);
	 bucket->flags ^= XML_SCHEMA_BUCKET_MARKED;
    }
    return(NULL);
}